

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_editor.c
# Opt level: O2

void glist_doreload(_glist *gl,t_symbol *name,t_symbol *dir,t_gobj *except)

{
  ushort uVar1;
  _glist *p_Var2;
  bool bVar3;
  int iVar4;
  undefined4 extraout_var;
  _glist *x;
  _glist *p_Var5;
  _glist *extraout_RAX;
  t_symbol *ptVar6;
  _glist *extraout_RAX_00;
  _glist *extraout_RAX_01;
  t_gobj **pptVar7;
  t_gobj **pptVar8;
  bool bVar9;
  
  uVar1 = *(ushort *)&gl->field_0xe8;
  p_Var5 = (_glist *)(ulong)uVar1;
  bVar3 = false;
  pptVar8 = &gl->gl_list;
  pptVar7 = pptVar8;
  while (p_Var2 = (_glist *)*pptVar7, p_Var2 != (_glist *)0x0) {
    bVar9 = true;
    if ((((p_Var2 != (_glist *)except) && ((p_Var2->gl_obj).te_g.g_pd == canvas_class)) &&
        (iVar4 = canvas_isabstraction(p_Var2), iVar4 != 0)) && (p_Var2->gl_name == name)) {
      ptVar6 = canvas_getdir(p_Var2);
      bVar9 = ptVar6 != dir;
    }
    p_Var5 = (_glist *)(p_Var2->gl_obj).te_g.g_pd;
    if (p_Var5 == (_glist *)clone_class) {
      iVar4 = clone_match((t_pd *)p_Var2,name,dir);
      p_Var5 = (_glist *)CONCAT71((int7)(CONCAT44(extraout_var,iVar4) >> 8),iVar4 == 0);
      bVar9 = (bool)(iVar4 == 0 & bVar9);
    }
    if (!bVar9) {
      canvas_create_editor(gl);
      if ((gl->field_0xe8 & 1) == 0) {
        p_Var5 = glist_getcanvas(x);
        canvas_vis(p_Var5,1.0);
      }
      if (!bVar3) {
        glist_noselect(gl);
      }
      glist_select(gl,(t_gobj *)p_Var2);
      bVar3 = true;
      p_Var5 = extraout_RAX;
    }
    pptVar7 = &(p_Var2->gl_obj).te_g.g_next;
  }
  if (bVar3) {
    canvas_cut(gl);
    canvas_undo_undo(gl);
    canvas_undo_rebranch(gl);
    glist_noselect(gl);
    p_Var5 = extraout_RAX_00;
  }
  while (p_Var2 = (_glist *)*pptVar8, p_Var2 != (_glist *)0x0) {
    if (((p_Var2 != (_glist *)except) &&
        (p_Var5 = (_glist *)(p_Var2->gl_obj).te_g.g_pd, p_Var5 == (_glist *)canvas_class)) &&
       ((iVar4 = canvas_isabstraction(p_Var2), iVar4 == 0 ||
        ((p_Var2->gl_name != name ||
         (p_Var5 = (_glist *)canvas_getdir(p_Var2), p_Var5 != (_glist *)dir)))))) {
      glist_doreload(p_Var2,name,dir,except);
      p_Var5 = extraout_RAX_01;
    }
    pptVar8 = &(p_Var2->gl_obj).te_g.g_next;
  }
  if (((uVar1 & 1) == 0) && ((gl->field_0xe8 & 1) != 0)) {
    p_Var5 = glist_getcanvas(p_Var5);
    canvas_vis(p_Var5,0.0);
    return;
  }
  return;
}

Assistant:

static void glist_doreload(t_glist *gl, t_symbol *name, t_symbol *dir,
    t_gobj *except)
{
    t_gobj *g;
    int hadwindow = gl->gl_havewindow;
    int found = 0;
        /* to optimize redrawing we select all objects that need to be updated
           and redraw (cut+undo) them together. Then we look for sub-patches that may have
           more of the same... */
    for (g = gl->gl_list; g; g = g->g_next)
    {
            /* remake the object if it's an abstraction that appears to have
               been loaded from the file we just saved */
        int remakeit = (g != except && pd_class(&g->g_pd) == canvas_class &&
            canvas_isabstraction((t_canvas *)g) &&
                ((t_canvas *)g)->gl_name == name &&
                    canvas_getdir((t_canvas *)g) == dir);
            /* also remake it if it's a "clone" with that name */
        if (pd_class(&g->g_pd) == clone_class &&
            clone_match(&g->g_pd, name, dir))
        {
                /* LATER try not to remake the one that equals "except" */
            remakeit = 1;
        }
        if (remakeit)
        {
                /* Bugfix for cases where canvas_vis doesn't actually create a
                   new editor. We need to fix canvas_vis so that the bug
                   doesn't get triggered. But since we know this fixes a
                   regression we'll keep this as a point in the history as we
                   fix canvas_vis. Once that's done we can remove this call. */
            canvas_create_editor(gl);

            if (!gl->gl_havewindow)
            {
                canvas_vis(glist_getcanvas(gl), 1);
            }
            if (!found)
            {
                glist_noselect(gl);
                found = 1;
            }
            glist_select(gl, g);
        }
    }
        /* cut all selected (matched) objects and undo, to reinstantiate them */
    if (found)
    {
        canvas_cut(gl);
        canvas_undo_undo(gl);
        canvas_undo_rebranch(gl);
        glist_noselect(gl);
    }

        /* now iterate over all the sub-patches... */
    for (g = gl->gl_list; g; g = g->g_next)
    {
        if (g != except && pd_class(&g->g_pd) == canvas_class &&
            (!canvas_isabstraction((t_canvas *)g) ||
                 ((t_canvas *)g)->gl_name != name ||
                 canvas_getdir((t_canvas *)g) != dir)
           )
                glist_doreload((t_canvas *)g, name, dir, except);
    }
    if (!hadwindow && gl->gl_havewindow)
        canvas_vis(glist_getcanvas(gl), 0);
}